

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O0

bool __thiscall absl::lts_20250127::Cord::Contains(Cord *this,string_view rhs)

{
  string_view needle;
  bool bVar1;
  bool local_161;
  CharIterator local_160;
  Cord *local_c8;
  size_t local_c0;
  CharIterator local_b8;
  Cord *local_20;
  Cord *this_local;
  string_view rhs_local;
  
  rhs_local._M_len = (size_t)rhs._M_str;
  this_local = (Cord *)rhs._M_len;
  local_20 = this;
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  local_161 = true;
  if (!bVar1) {
    local_c8 = this_local;
    local_c0 = rhs_local._M_len;
    needle._M_str = (char *)rhs_local._M_len;
    needle._M_len = (size_t)this_local;
    Find(&local_b8,this,needle);
    char_end(&local_160,this);
    local_161 = CharIterator::operator!=(&local_b8,&local_160);
  }
  return local_161;
}

Assistant:

bool Cord::Contains(absl::string_view rhs) const {
  return rhs.empty() || Find(rhs) != char_end();
}